

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool SplitHostPort(string_view in,uint16_t *portOut,string *hostOut)

{
  long lVar1;
  string_view str;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  short *in_RDX;
  long in_FS_OFFSET;
  byte bVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  bool fMultiColon;
  bool fBracketed;
  bool fHaveColon;
  size_t colon;
  bool valid;
  uint16_t n;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  char in_stack_ffffffffffffff87;
  undefined1 uVar9;
  undefined1 __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined5 in_stack_ffffffffffffff98;
  undefined1 uVar10;
  byte bVar11;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar12;
  short local_1a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar12 = 0;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff87,(size_type)in_stack_ffffffffffffff78);
  bVar7 = sVar3 != 0xffffffffffffffff;
  uVar9 = false;
  __c = uVar9;
  if ((bool)bVar7) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff88,
                        (ulong)CONCAT16(in_stack_ffffffffffffff86,
                                        CONCAT15(in_stack_ffffffffffffff85,
                                                 CONCAT14(in_stack_ffffffffffffff84,
                                                          in_stack_ffffffffffffff80))));
    in_stack_ffffffffffffff86 = false;
    __c = in_stack_ffffffffffffff86;
    if (*pvVar4 == '[') {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_ffffffffffffff88,
                          CONCAT17(uVar9,(uint7)CONCAT15(in_stack_ffffffffffffff85,
                                                         CONCAT14(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80))));
      in_stack_ffffffffffffff86 = *pvVar4 == ']';
      __c = in_stack_ffffffffffffff86;
    }
  }
  uVar9 = false;
  bVar11 = __c;
  if (((bVar7 & 1) != 0) && (uVar9 = false, sVar3 != 0)) {
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff88
                       ,__c,(size_type)in_stack_ffffffffffffff78);
    uVar9 = sVar5 != 0xffffffffffffffff;
  }
  uVar10 = uVar9;
  if (((bVar7 & 1) == 0) || (((sVar3 != 0 && ((bVar11 & 1) == 0)) && ((bool)uVar9 != false)))) {
    bVar12 = 1;
  }
  else {
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(bVar7,CONCAT16(bVar11,CONCAT15(uVar9,in_stack_ffffffffffffff98))),
                       (size_type)in_stack_ffffffffffffff90,
                       CONCAT17(bVar12,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffff88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar8._M_len;
    in_stack_ffffffffffffff90 = bVar8._M_str;
    str._M_str._0_5_ = in_stack_ffffffffffffff98;
    str._M_len = (size_t)in_stack_ffffffffffffff90;
    str._M_str._5_1_ = uVar10;
    str._M_str._6_1_ = bVar11;
    str._M_str._7_1_ = bVar7;
    bVar2 = ParseUInt16(str,(uint16_t *)in_stack_ffffffffffffff78);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(bVar7,CONCAT16(bVar11,CONCAT15(uVar10,in_stack_ffffffffffffff98))),
                 (size_type)in_stack_ffffffffffffff90,CONCAT17(bVar12,in_stack_ffffffffffffffa8));
      *in_RDX = local_1a;
      bVar12 = *in_RDX != 0;
    }
  }
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff78);
  if ((sVar6 != 0) &&
     (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_ffffffffffffff88,
                          CONCAT17(__c,CONCAT16(in_stack_ffffffffffffff86,
                                                CONCAT15(uVar9,CONCAT14(in_stack_ffffffffffffff84,
                                                                        in_stack_ffffffffffffff80)))
                                  )), *pvVar4 == '[')) {
    std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff78);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff88,
                        CONCAT17(__c,CONCAT16(in_stack_ffffffffffffff86,
                                              CONCAT15(uVar9,CONCAT14(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80)))))
    ;
    if (*pvVar4 == ']') {
      std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff78);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(bVar7,CONCAT16(bVar11,CONCAT15(uVar10,in_stack_ffffffffffffff98))),
                 (size_type)in_stack_ffffffffffffff90,CONCAT17(bVar12,in_stack_ffffffffffffffa8));
      std::__cxx11::string::operator=
                (in_stack_ffffffffffffff88,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(__c,CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(uVar9,CONCAT14(in_stack_ffffffffffffff84,
                                                               in_stack_ffffffffffffff80)))));
      goto LAB_0035fa61;
    }
  }
  std::__cxx11::string::operator=
            (in_stack_ffffffffffffff88,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(__c,CONCAT16(in_stack_ffffffffffffff86,
                                   CONCAT15(uVar9,CONCAT14(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80)))));
LAB_0035fa61:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool SplitHostPort(std::string_view in, uint16_t& portOut, std::string& hostOut)
{
    bool valid = false;
    size_t colon = in.find_last_of(':');
    // if a : is found, and it either follows a [...], or no other : is in the string, treat it as port separator
    bool fHaveColon = colon != in.npos;
    bool fBracketed = fHaveColon && (in[0] == '[' && in[colon - 1] == ']'); // if there is a colon, and in[0]=='[', colon is not 0, so in[colon-1] is safe
    bool fMultiColon{fHaveColon && colon != 0 && (in.find_last_of(':', colon - 1) != in.npos)};
    if (fHaveColon && (colon == 0 || fBracketed || !fMultiColon)) {
        uint16_t n;
        if (ParseUInt16(in.substr(colon + 1), &n)) {
            in = in.substr(0, colon);
            portOut = n;
            valid = (portOut != 0);
        }
    } else {
        valid = true;
    }
    if (in.size() > 0 && in[0] == '[' && in[in.size() - 1] == ']') {
        hostOut = in.substr(1, in.size() - 2);
    } else {
        hostOut = in;
    }

    return valid;
}